

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_CutDsdBalanceEval(If_Man_t *p,If_Cut_t *pCut,Vec_Int_t *vAig)

{
  If_DsdMan_t *p_00;
  int iVar1;
  If_Obj_t *pIVar2;
  If_Cut_t *pIVar3;
  char *pPermLits_00;
  int nCountMax;
  int iMax;
  char *pPermLits;
  int Area;
  int Delay;
  int pTimes [15];
  int local_34;
  int i;
  int fVerbose;
  int fUseCofs;
  Vec_Int_t *vAig_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffdfff | 0x2000;
  if (vAig != (Vec_Int_t *)0x0) {
    Vec_IntClear(vAig);
  }
  if (*(uint *)&pCut->field_0x1c >> 0x18 == 0) {
    iVar1 = If_CutDsdLit(p,pCut);
    iVar1 = Abc_Lit2Var(iVar1);
    if (iVar1 != 0) {
      __assert_fail("Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x91a,"int If_CutDsdBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      iVar1 = If_CutDsdLit(p,pCut);
      iVar1 = Abc_LitIsCompl(iVar1);
      Vec_IntPush(vAig,iVar1);
    }
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000;
    p_local._4_4_ = 0;
  }
  else if (*(uint *)&pCut->field_0x1c >> 0x18 == 1) {
    iVar1 = If_CutDsdLit(p,pCut);
    iVar1 = Abc_Lit2Var(iVar1);
    if (iVar1 != 1) {
      __assert_fail("Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x922,"int If_CutDsdBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      Vec_IntPush(vAig,0);
      iVar1 = If_CutDsdLit(p,pCut);
      iVar1 = Abc_LitIsCompl(iVar1);
      Vec_IntPush(vAig,iVar1);
    }
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000;
    pIVar2 = If_CutLeaf(p,pCut,0);
    pIVar3 = If_ObjCutBest(pIVar2);
    p_local._4_4_ = (int)pIVar3->Delay;
  }
  else {
    pPermLits._0_4_ = 0;
    If_CutDsdPerm(p,pCut);
    for (local_34 = 0; iVar1 = If_CutLeaveNum(pCut), local_34 < iVar1; local_34 = local_34 + 1) {
      pIVar2 = If_CutLeaf(p,pCut,local_34);
      pIVar3 = If_ObjCutBest(pIVar2);
      (&Area)[local_34] = (int)pIVar3->Delay;
    }
    p_00 = p->pIfDsdMan;
    iVar1 = If_CutDsdLit(p,pCut);
    iVar1 = Abc_LitNotCond(iVar1,*(uint *)&pCut->field_0x1c >> 0xc & 1);
    pPermLits_00 = If_CutDsdPerm(p,pCut);
    p_local._4_4_ = If_CutDsdBalanceEvalInt(p_00,iVar1,&Area,vAig,(int *)&pPermLits,pPermLits_00);
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | (uint)pPermLits & 0xfff;
  }
  return p_local._4_4_;
}

Assistant:

int If_CutDsdBalanceEval( If_Man_t * p, If_Cut_t * pCut, Vec_Int_t * vAig )
{
    int fUseCofs = 0;
    pCut->fUser = 1;
    if ( vAig )
        Vec_IntClear( vAig );
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutDsdLit(p, pCut)) );
        pCut->Cost = 0;
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutDsdLit(p, pCut)) == 1 );
        if ( vAig )
            Vec_IntPush( vAig, 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutDsdLit(p, pCut)) );
        pCut->Cost = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        int fVerbose = 0;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        int Delay, Area = 0;
        char * pPermLits = If_CutDsdPerm(p, pCut);
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        Delay = If_CutDsdBalanceEvalInt( p->pIfDsdMan, Abc_LitNotCond(If_CutDsdLit(p, pCut), pCut->fCompl), pTimes, vAig, &Area, If_CutDsdPerm(p, pCut) );
        pCut->Cost = Area;
        // try cofactoring 
        if ( fUseCofs )
        {
            // count how many times the max one appears
            int iMax = 0, nCountMax = 1;
            for ( i = 1; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] > pTimes[iMax] )
                    iMax = i, nCountMax = 1;
                else if ( pTimes[i] == pTimes[iMax] )
                    nCountMax++;
            // decide when to try the decomposition
            if ( nCountMax == 1 && pTimes[iMax] + 2 < Delay && If_DsdManCheckNonTriv( p->pIfDsdMan, Abc_Lit2Var(If_CutDsdLit(p, pCut)), 
                 If_CutLeaveNum(pCut), If_CutDsdPermLitMax(pPermLits, If_CutLeaveNum(pCut), iMax)) )
            {
//                fVerbose = 1;
                Delay = pTimes[iMax] + 2;
            }
        }
        // report the result
        if ( fVerbose )
        {
/*
            int Max = 0, Two = 0;
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                Max = Abc_MaxInt( Max, pTimes[i] );
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] != Max )
                    Two = Abc_MaxInt( Two, pTimes[i] );
            if ( Two + 2 < Max && Max + 3 < Delay )
*/
            {
                for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                    printf( "%3d ", pTimes[Abc_Lit2Var(pPermLits[i])] );
                for ( ; i < p->pPars->nLutSize; i++ )
                    printf( "    " );
                printf( "-> %3d   ", Delay );
                If_DsdManPrintOne( stdout, p->pIfDsdMan, Abc_Lit2Var(If_CutDsdLit(p, pCut)), NULL, 0 );
                printf( "\n" );
            }
        }
        return Delay;
    }
}